

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O2

void WebRtcIsac_InitPitchAnalysis(PitchAnalysisStruct *State)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x48; lVar1 = lVar1 + 1) {
    State->dec_buffer[lVar1] = 0.0;
  }
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    State->decimator_state[lVar1] = 0.0;
  }
  State->hp_state[0] = 0.0;
  State->hp_state[1] = 0.0;
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 1) {
    State->whitened_buf[lVar1] = 0.0;
  }
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 1) {
    State->inbuf[lVar1] = 0.0;
  }
  WebRtcIsac_InitPitchFilter(&State->PFstr_wght);
  WebRtcIsac_InitPitchFilter(&State->PFstr);
  WebRtcIsac_InitWeightingFilter(&State->Wghtstr);
  return;
}

Assistant:

void WebRtcIsac_InitPitchAnalysis(PitchAnalysisStruct *State)
{
  int k;

  for (k = 0; k < PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2; k++)
    State->dec_buffer[k] = 0.0;
  for (k = 0; k < 2*ALLPASSSECTIONS+1; k++)
    State->decimator_state[k] = 0.0;
  for (k = 0; k < 2; k++)
    State->hp_state[k] = 0.0;
  for (k = 0; k < QLOOKAHEAD; k++)
    State->whitened_buf[k] = 0.0;
  for (k = 0; k < QLOOKAHEAD; k++)
    State->inbuf[k] = 0.0;

  WebRtcIsac_InitPitchFilter(&(State->PFstr_wght));

  WebRtcIsac_InitPitchFilter(&(State->PFstr));

  WebRtcIsac_InitWeightingFilter(&(State->Wghtstr));
}